

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::ReservedNamesTest::iterate(ReservedNamesTest *this)

{
  ostringstream *this_00;
  _shader_type shader_type;
  _language_feature language_feature;
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  pointer paVar7;
  pointer paVar8;
  pointer pbVar9;
  char *pcVar10;
  ReservedNamesTest *this_01;
  GLint compile_status;
  char *so_body_string_raw;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_names;
  vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  language_features;
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  shader_types;
  string so_body_string;
  string current_invalid_name;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  long lVar6;
  
  compile_status = 1;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  language_features.
  super__Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  language_features.
  super__Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  language_features.
  super__Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reserved_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reserved_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reserved_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shader_types.
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shader_types.
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shader_types.
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x124);
  if (bVar1) {
    (**(code **)(lVar6 + 0x868))(0x92d5,&this->m_max_gs_acs);
    (**(code **)(lVar6 + 0x868))(0x92d3,&this->m_max_tc_acs);
    (**(code **)(lVar6 + 0x868))(0x92d4,&this->m_max_te_acs);
    (**(code **)(lVar6 + 0x868))(0x92d2,&this->m_max_vs_acs);
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar1) {
    (**(code **)(lVar6 + 0x868))(0x90da,&this->m_max_fs_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d7,&this->m_max_gs_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d8,&this->m_max_tc_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d9,&this->m_max_te_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d6,&this->m_max_vs_ssbos);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x1507);
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar1) {
    GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
    this->m_so_ids[3] = GVar5;
    GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
    this->m_so_ids[4] = GVar5;
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar1) {
    GVar5 = (**(code **)(lVar6 + 0x3f0))(0x91b9);
    this->m_so_ids[0] = GVar5;
  }
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_so_ids[1] = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_so_ids[2] = GVar5;
  GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_so_ids[5] = GVar5;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x151a);
  getReservedNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b0,this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&reserved_names,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b0);
  getSupportedShaderTypes
            ((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
              *)local_1b0,this);
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::_M_move_assign(&shader_types,
                   (_Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                    *)local_1b0);
  std::
  _Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::~_Vector_base((_Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                   *)local_1b0);
  bVar1 = true;
  this_00 = (ostringstream *)(local_1b0 + 8);
  paVar7 = shader_types.
           super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar7 == shader_types.
                  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar10 = "Fail";
      if (bVar1) {
        pcVar10 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar1,
                 pcVar10);
      std::
      _Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
      ::~_Vector_base(&shader_types.
                       super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                     );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&reserved_names);
      std::
      _Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
      ::~_Vector_base(&language_features.
                       super__Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                     );
      return STOP;
    }
    shader_type = *paVar7;
    if (this->m_so_ids[shader_type] != 0) {
      this_01 = (ReservedNamesTest *)local_1b0;
      getSupportedLanguageFeatures
                ((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                  *)this_01,this,shader_type);
      std::
      vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
      ::_M_move_assign(&language_features,this_01);
      std::
      _Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
      ::~_Vector_base((_Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                       *)this_01);
      for (paVar8 = language_features.
                    super__Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar8 != language_features.
                    super__Vector_base<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                    ._M_impl.super__Vector_impl_data._M_finish; paVar8 = paVar8 + 1) {
        language_feature = *paVar8;
        bVar2 = isStructAllowed(this_01,shader_type,language_feature);
        for (pbVar9 = reserved_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar9 != reserved_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
          std::__cxx11::string::string((string *)&current_invalid_name,(string *)pbVar9);
          so_body_string._M_dataplus._M_p = (pointer)&so_body_string.field_2;
          so_body_string._M_string_length = 0;
          so_body_string.field_2._M_local_buf[0] = '\0';
          so_body_string_raw = (char *)0x0;
          if (bVar2) {
            iVar3 = std::__cxx11::string::compare((char *)&current_invalid_name);
            if (iVar3 != 0) goto LAB_00aea4d3;
          }
          else {
LAB_00aea4d3:
            getShaderBody_abi_cxx11_
                      ((string *)local_1b0,this,shader_type,language_feature,
                       current_invalid_name._M_dataplus._M_p);
            std::__cxx11::string::operator=((string *)&so_body_string,(string *)local_1b0);
            std::__cxx11::string::~string((string *)local_1b0);
            so_body_string_raw = so_body_string._M_dataplus._M_p;
            (**(code **)(lVar6 + 0x12b8))(this->m_so_ids[shader_type],1,&so_body_string_raw,0);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glShaderSource() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x154c);
            (**(code **)(lVar6 + 0x248))(this->m_so_ids[shader_type]);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glCompileShader() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x154f);
            (**(code **)(lVar6 + 0xa70))(this->m_so_ids[shader_type],0x8b81,&compile_status);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetShaderiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1552);
            if (compile_status != 0) {
              local_1b0._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              pcVar10 = "A ";
              std::operator<<((ostream *)this_00,"A ");
              getLanguageFeatureName_abi_cxx11_
                        (&local_1d0,(ReservedNamesTest *)pcVar10,language_feature);
              std::operator<<((ostream *)this_00,(string *)&local_1d0);
              std::operator<<((ostream *)this_00," named [");
              std::operator<<((ostream *)this_00,(string *)&current_invalid_name);
              std::operator<<((ostream *)this_00,"]");
              pcVar10 = ", defined in ";
              std::operator<<((ostream *)this_00,", defined in ");
              getShaderTypeName_abi_cxx11_(&local_1f0,(ReservedNamesTest *)pcVar10,shader_type);
              std::operator<<((ostream *)this_00,(string *)&local_1f0);
              std::operator<<((ostream *)this_00,
                              ", was accepted by the compiler, which is prohibited by the spec. Offending source code:\n>>\n"
                             );
              std::operator<<((ostream *)this_00,so_body_string_raw);
              std::operator<<((ostream *)this_00,"\n<<\n\n");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              bVar1 = false;
            }
          }
          std::__cxx11::string::~string((string *)&so_body_string);
          this_01 = (ReservedNamesTest *)&current_invalid_name;
          std::__cxx11::string::~string((string *)this_01);
        }
      }
    }
    paVar7 = paVar7 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult ReservedNamesTest::iterate()
{
	glw::GLint					   compile_status = GL_TRUE;
	glu::ContextType			   context_type   = m_context.getRenderContext().getType();
	const glw::Functions&		   gl			  = m_context.getRenderContext().getFunctions();
	std::vector<_language_feature> language_features;
	std::vector<std::string>	   reserved_names;
	bool						   result = true;
	std::vector<_shader_type>	  shader_types;

	/* Retrieve important GL constant values */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 2)))
	{
		gl.getIntegerv(GL_MAX_GEOMETRY_ATOMIC_COUNTERS, &m_max_gs_acs);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS, &m_max_tc_acs);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS, &m_max_te_acs);
		gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_max_vs_acs);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		gl.getIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &m_max_fs_ssbos);
		gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &m_max_gs_ssbos);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, &m_max_tc_ssbos);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &m_max_te_ssbos);
		gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &m_max_vs_ssbos);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed.");
	}

	/* Create the shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_so_ids[SHADER_TYPE_TESS_CONTROL]	= gl.createShader(GL_TESS_CONTROL_SHADER);
		m_so_ids[SHADER_TYPE_TESS_EVALUATION] = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		m_so_ids[SHADER_TYPE_COMPUTE] = gl.createShader(GL_COMPUTE_SHADER);
	}

	m_so_ids[SHADER_TYPE_FRAGMENT] = gl.createShader(GL_FRAGMENT_SHADER);
	m_so_ids[SHADER_TYPE_GEOMETRY] = gl.createShader(GL_GEOMETRY_SHADER);
	m_so_ids[SHADER_TYPE_VERTEX]   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Retrieve context version-specific data */
	reserved_names = getReservedNames();
	shader_types   = getSupportedShaderTypes();

	/* Iterate over all supported shader stages.. */
	for (std::vector<_shader_type>::const_iterator shader_type_it = shader_types.begin();
		 shader_type_it != shader_types.end(); ++shader_type_it)
	{
		_shader_type current_shader_type = *shader_type_it;

		if (m_so_ids[current_shader_type] == 0)
		{
			/* Skip stages not supported by the currently running context version. */
			continue;
		}

		language_features = getSupportedLanguageFeatures(current_shader_type);

		/* ..and all language features we can test for the running context */
		for (std::vector<_language_feature>::const_iterator language_feature_it = language_features.begin();
			 language_feature_it != language_features.end(); ++language_feature_it)
		{
			_language_feature current_language_feature = *language_feature_it;

			bool structAllowed = isStructAllowed(current_shader_type, current_language_feature);

			/* Finally, all the reserved names we need to test - loop over them at this point */
			for (std::vector<std::string>::const_iterator reserved_name_it = reserved_names.begin();
				 reserved_name_it != reserved_names.end(); ++reserved_name_it)
			{
				std::string current_invalid_name = *reserved_name_it;
				std::string so_body_string;
				const char* so_body_string_raw = NULL;

				// There are certain shader types that allow struct for in/out declarations
				if (structAllowed && current_invalid_name.compare("struct") == 0)
				{
					continue;
				}

				/* Form the shader body */
				so_body_string =
					getShaderBody(current_shader_type, current_language_feature, current_invalid_name.c_str());
				so_body_string_raw = so_body_string.c_str();

				/* Try to compile the shader */
				gl.shaderSource(m_so_ids[current_shader_type], 1, /* count */
								&so_body_string_raw, NULL);		  /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

				gl.compileShader(m_so_ids[current_shader_type]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(m_so_ids[current_shader_type], GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

/* Left for the debugging purposes for those in need .. */
#if 0
				char temp[4096];

				gl.getShaderInfoLog(m_so_ids[current_shader_type],
					4096,
					NULL,
					temp);

				m_testCtx.getLog() << tcu::TestLog::Message
					<< "\n"
					"-----------------------------\n"
					"Shader:\n"
					">>\n"
					<< so_body_string_raw
					<< "\n<<\n"
					"\n"
					"Info log:\n"
					">>\n"
					<< temp
					<< "\n<<\n\n"
					<< tcu::TestLog::EndMessage;
#endif

				if (compile_status != GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A "
									   << getLanguageFeatureName(current_language_feature) << " named ["
									   << current_invalid_name << "]"
									   << ", defined in " << getShaderTypeName(current_shader_type)
									   << ", was accepted by the compiler, "
										  "which is prohibited by the spec. Offending source code:\n"
										  ">>\n"
									   << so_body_string_raw << "\n<<\n\n"
									   << tcu::TestLog::EndMessage;

					result = false;
				}

			} /* for (all reserved names for the current context) */
		}	 /* for (all language features supported by the context) */
	}		  /* for (all shader types supported by the context) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}